

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_tlm(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 l_Ptlm_size;
  OPJ_UINT32 l_quotient;
  OPJ_UINT32 l_tot_num_tp_remaining;
  OPJ_UINT32 l_SP;
  OPJ_UINT32 l_ST;
  OPJ_UINT32 l_Stlm;
  OPJ_UINT32 l_Ztlm;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  _l_Stlm = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xe0a,
                  "OPJ_BOOL opj_j2k_read_tlm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      if (p_header_size < 2) {
        opj_event_msg(p_manager,1,"Error reading TLM marker\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        p_manager_local._4_4_ = p_header_size - 2;
        opj_read_bytes_LE(p_header_data,&l_ST,1);
        pOStack_20 = pOStack_20 + 1;
        opj_read_bytes_LE(pOStack_20,&l_SP,1);
        pOStack_20 = pOStack_20 + 1;
        if (p_manager_local._4_4_ % (((l_SP >> 6 & 1) + 1) * 2 + (l_SP >> 4 & 3)) == 0) {
          p_j2k_local._4_4_ = 1;
        }
        else {
          opj_event_msg(_l_Stlm,1,"Error reading TLM marker\n");
          p_j2k_local._4_4_ = 0;
        }
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xe0c,
                  "OPJ_BOOL opj_j2k_read_tlm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xe0b,
                "OPJ_BOOL opj_j2k_read_tlm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_tlm(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_Ztlm, l_Stlm, l_ST, l_SP, l_tot_num_tp_remaining, l_quotient,
               l_Ptlm_size;
    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_j2k);

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading TLM marker\n");
        return OPJ_FALSE;
    }
    p_header_size -= 2;

    opj_read_bytes(p_header_data, &l_Ztlm,
                   1);                              /* Ztlm */
    ++p_header_data;
    opj_read_bytes(p_header_data, &l_Stlm,
                   1);                              /* Stlm */
    ++p_header_data;

    l_ST = ((l_Stlm >> 4) & 0x3);
    l_SP = (l_Stlm >> 6) & 0x1;

    l_Ptlm_size = (l_SP + 1) * 2;
    l_quotient = l_Ptlm_size + l_ST;

    l_tot_num_tp_remaining = p_header_size % l_quotient;

    if (l_tot_num_tp_remaining != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading TLM marker\n");
        return OPJ_FALSE;
    }
    /* FIXME Do not care of this at the moment since only local variables are set here */
    /*
    for
            (i = 0; i < l_tot_num_tp; ++i)
    {
            opj_read_bytes(p_header_data,&l_Ttlm_i,l_ST);                           // Ttlm_i
            p_header_data += l_ST;
            opj_read_bytes(p_header_data,&l_Ptlm_i,l_Ptlm_size);            // Ptlm_i
            p_header_data += l_Ptlm_size;
    }*/
    return OPJ_TRUE;
}